

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_cast.cpp
# Opt level: O1

string_t duckdb::StringCast::Operation<duckdb::date_t>(date_t input,Vector *vector)

{
  bool bVar1;
  int iVar2;
  undefined **ppuVar3;
  long lVar4;
  ulong uVar5;
  idx_t len;
  char *data;
  anon_union_16_2_67f50693_for_value aVar6;
  int32_t date [3];
  string_t result;
  int local_34;
  int32_t local_30;
  int32_t local_2c;
  undefined1 local_28 [16];
  
  if (input.days == -0x7fffffff) {
    ppuVar3 = &Date::NINF;
  }
  else {
    if (input.days != 0x7fffffff) {
      Date::Convert(input,&local_34,&local_30,&local_2c);
      iVar2 = local_34;
      lVar4 = 6;
      if (local_34 < 1) {
        local_34 = 1 - local_34;
        lVar4 = 0xb;
      }
      len = (ulong)(999999 < local_34) + (ulong)(99999 < local_34) + (ulong)(9999 < local_34);
      bVar1 = 9999999 < local_34;
      local_28 = (undefined1  [16])
                 StringVector::EmptyString
                           ((StringVector *)vector,(Vector *)(lVar4 + len + bVar1 + 4),len);
      data = local_28._8_8_;
      if (local_28._0_4_ < 0xd) {
        data = local_28 + 4;
      }
      DateToStringCast::Format(data,local_34,local_30,local_2c,bVar1 + len + 4,iVar2 < 1);
      uVar5 = (ulong)(uint)local_28._0_4_;
      if (uVar5 < 0xd) {
        switchD_01306cb1::default(local_28 + 4 + uVar5,0,0xc - uVar5);
        return (string_t)(anon_union_16_2_67f50693_for_value)local_28;
      }
      local_28._4_4_ = *(undefined4 *)local_28._8_8_;
      return (string_t)(anon_union_16_2_67f50693_for_value)local_28;
    }
    ppuVar3 = (undefined **)&Date::PINF;
  }
  aVar6.pointer = (anon_struct_16_3_d7536bce_for_pointer)StringVector::AddString(vector,*ppuVar3);
  return (anon_union_16_2_67f50693_for_value)(anon_union_16_2_67f50693_for_value)aVar6.pointer;
}

Assistant:

duckdb::string_t StringCast::Operation(date_t input, Vector &vector) {
	if (input == date_t::infinity()) {
		return StringVector::AddString(vector, Date::PINF);
	} else if (input == date_t::ninfinity()) {
		return StringVector::AddString(vector, Date::NINF);
	}
	int32_t date[3];
	Date::Convert(input, date[0], date[1], date[2]);

	idx_t year_length;
	bool add_bc;
	idx_t length = DateToStringCast::Length(date, year_length, add_bc);

	string_t result = StringVector::EmptyString(vector, length);
	auto data = result.GetDataWriteable();

	DateToStringCast::Format(data, date, year_length, add_bc);

	result.Finalize();
	return result;
}